

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

string * __thiscall
spvtools::val::ValidationState_t::getIdName_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t id)

{
  ostream *poVar1;
  string id_name;
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  uint32_t local_1b0 [4];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1b0[0] = id;
  if ((this->name_mapper_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->name_mapper_)._M_invoker)(&local_1d0,(_Any_data *)&this->name_mapper_,local_1b0);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\'",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[%",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\'",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::string ValidationState_t::getIdName(uint32_t id) const {
  const std::string id_name = name_mapper_(id);

  std::stringstream out;
  out << "'" << id << "[%" << id_name << "]'";
  return out.str();
}